

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O3

void __thiscall kj::writeLineToFd(kj *this,int fd,StringPtr message)

{
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  char *pcVar4;
  int __count;
  undefined4 in_register_00000034;
  iovec *__iovec;
  iovec vec [2];
  iovec local_38;
  char *local_28;
  undefined8 local_20;
  
  local_38.iov_base = (void *)CONCAT44(in_register_00000034,fd);
  pcVar4 = message.content.ptr;
  local_38.iov_len = (size_t)(pcVar4 + -1);
  if ((char *)local_38.iov_len != (char *)0x0) {
    local_28 = "\n";
    local_20 = 1;
    __count = 2;
    __iovec = &local_38;
    if ((char *)0x1 < pcVar4) {
      __count = (pcVar4[(long)local_38.iov_base + -2] != '\n') + 1;
      __iovec = &local_38;
    }
    do {
      while (uVar2 = writev((int)this,__iovec,__count), -1 < (long)uVar2) {
        while( true ) {
          uVar1 = __iovec->iov_len;
          if (uVar2 <= uVar1 && uVar1 - uVar2 != 0) break;
          uVar2 = uVar2 - uVar1;
          __iovec = __iovec + 1;
          __count = __count + -1;
          if (__count == 0) {
            return;
          }
        }
        __iovec->iov_base = (void *)((long)__iovec->iov_base + uVar2);
        __iovec->iov_len = uVar1 - uVar2;
      }
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  }
  return;
}

Assistant:

static void writeLineToFd(int fd, StringPtr message) {
  // Write the given message to the given file descriptor with a trailing newline iff the message
  // is non-empty and doesn't already have a trailing newline.  We use writev() to do this in a
  // single system call without any copying (OS permitting).

  if (message.size() == 0) {
    return;
  }

#if _WIN32
  KJ_STACK_ARRAY(char, newlineExpansionBuffer, 2 * (message.size() + 1), 128, 512);
  char* p = newlineExpansionBuffer.begin();
  for(char ch : message) {
    if(ch == '\n') {
      *(p++) = '\r';
    }
    *(p++) = ch;
  }
  if(!message.endsWith("\n")) {
    *(p++) = '\r';
    *(p++) = '\n';
  }

  size_t newlineExpandedSize = p - newlineExpansionBuffer.begin();

  KJ_ASSERT(newlineExpandedSize <= newlineExpansionBuffer.size());

  HANDLE handle = reinterpret_cast<HANDLE>(_get_osfhandle(fd));
  DWORD consoleMode;
  bool redirectedToFile = !GetConsoleMode(handle, &consoleMode);

  DWORD writtenSize;
  if(redirectedToFile) {
    WriteFile(handle, newlineExpansionBuffer.begin(), newlineExpandedSize, &writtenSize, nullptr);
  } else {
    KJ_STACK_ARRAY(wchar_t, buffer, newlineExpandedSize, 128, 512);

    size_t finalSize = MultiByteToWideChar(
      CP_UTF8,
      0,
      newlineExpansionBuffer.begin(),
      newlineExpandedSize,
      buffer.begin(),
      buffer.size());

    KJ_ASSERT(finalSize <= buffer.size());

    WriteConsoleW(handle, buffer.begin(), finalSize, &writtenSize, nullptr);
  }
#else
  // Unfortunately the writev interface requires non-const pointers even though it won't modify
  // the data.
  struct iovec vec[2];
  vec[0].iov_base = const_cast<char*>(message.begin());
  vec[0].iov_len = message.size();
  vec[1].iov_base = const_cast<char*>("\n");
  vec[1].iov_len = 1;

  struct iovec* pos = vec;

  // Only use the second item in the vec if the message doesn't already end with \n.
  uint count = message.endsWith("\n") ? 1 : 2;

  for (;;) {
    ssize_t n = writev(fd, pos, count);
    if (n < 0) {
      if (errno == EINTR) {
        continue;
      } else {
        // This function is meant for writing to stdout and stderr.  If writes fail on those FDs
        // there's not a whole lot we can reasonably do, so just ignore it.
        return;
      }
    }

    // Update chunks to discard what was successfully written.
    for (;;) {
      if (count == 0) {
        // Done writing.
        return;
      } else if (pos->iov_len <= implicitCast<size_t>(n)) {
        // Wrote this entire chunk.
        n -= pos->iov_len;
        ++pos;
        --count;
      } else {
        // Wrote only part of this chunk.  Adjust the pointer and then retry.
        pos->iov_base = reinterpret_cast<byte*>(pos->iov_base) + n;
        pos->iov_len -= n;
        break;
      }
    }
  }
#endif
}